

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::DetectMapConflicts
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  long lVar1;
  long lVar2;
  string *psVar3;
  long *plVar4;
  iterator iVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  long lVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long lVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_bool>
  pVar11;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  seen_types;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>
  local_c0;
  DescriptorBuilder *local_98;
  DescriptorProto *local_90;
  Descriptor *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = this;
  local_90 = proto;
  local_88 = message;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(message + 0x70)) {
    lVar10 = 0;
    lVar8 = 0;
    do {
      local_c0.first._M_dataplus._M_p = (pointer)&local_c0.first.field_2;
      lVar1 = *(long *)(message + 0x38);
      lVar2 = **(long **)(lVar1 + lVar10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,lVar2,(*(long **)(lVar1 + lVar10))[1] + lVar2);
      local_c0.second = (Descriptor *)(lVar1 + lVar10);
      pVar11 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>>
               ::
               _M_emplace_unique<std::pair<std::__cxx11::string,google::protobuf::Descriptor_const*>>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>>
                           *)&local_60,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.first._M_dataplus._M_p != &local_c0.first.field_2) {
        operator_delete(local_c0.first._M_dataplus._M_p);
      }
      message = local_88;
      if ((((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         ((*(char *)(*(long *)(*(long *)(pVar11.first._M_node._M_node + 2) + 0x20) + 0x4b) != '\0'
          || (*(char *)(*(long *)(lVar1 + 0x20 + lVar10) + 0x4b) == '\x01')))) {
        psVar3 = *(string **)(local_88 + 8);
        std::operator+(&local_80,"Expanded map entry type ",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar1 + lVar10));
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
        paVar9 = &local_c0.first.field_2;
        psVar7 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_c0.first.field_2._M_allocated_capacity = *psVar7;
          local_c0.first.field_2._8_8_ = plVar4[3];
          local_c0.first._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          local_c0.first.field_2._M_allocated_capacity = *psVar7;
          local_c0.first._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_c0.first._M_string_length = plVar4[1];
        *plVar4 = (long)psVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        AddError(local_98,psVar3,&local_90->super_Message,NAME,&local_c0.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.first._M_dataplus._M_p != paVar9) {
          operator_delete(local_c0.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
      DetectMapConflicts(local_98,(Descriptor *)(*(long *)(message + 0x38) + lVar10),
                         (DescriptorProto *)
                         ((local_90->nested_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar8]
                        );
      lVar8 = lVar8 + 1;
      lVar10 = lVar10 + 0x90;
    } while (lVar8 < *(int *)(message + 0x70));
  }
  paVar9 = &local_c0.first.field_2;
  if (0 < *(int *)(message + 0x68)) {
    lVar8 = 0;
    lVar10 = 0;
    do {
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
              ::find(&local_60,*(key_type **)(*(long *)(message + 0x28) + lVar8));
      if (((_Rb_tree_header *)iVar5._M_node != &local_60._M_impl.super__Rb_tree_header) &&
         (*(char *)((*(undefined8 **)(iVar5._M_node + 2))[4] + 0x4b) == '\x01')) {
        psVar3 = *(string **)(message + 8);
        std::operator+(&local_80,"Expanded map entry type ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       **(undefined8 **)(iVar5._M_node + 2));
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
        psVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_c0.first.field_2._M_allocated_capacity = *psVar7;
          local_c0.first.field_2._8_8_ = puVar6[3];
          local_c0.first._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          local_c0.first.field_2._M_allocated_capacity = *psVar7;
          local_c0.first._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_c0.first._M_string_length = puVar6[1];
        *puVar6 = psVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        AddError(local_98,psVar3,&local_90->super_Message,NAME,&local_c0.first);
        message = local_88;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.first._M_dataplus._M_p != paVar9) {
          operator_delete(local_c0.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0x98;
    } while (lVar10 < *(int *)(message + 0x68));
  }
  if (0 < *(int *)(message + 0x74)) {
    lVar8 = 0;
    lVar10 = 0;
    do {
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
              ::find(&local_60,*(key_type **)(*(long *)(message + 0x40) + lVar8));
      if (((_Rb_tree_header *)iVar5._M_node != &local_60._M_impl.super__Rb_tree_header) &&
         (*(char *)((*(undefined8 **)(iVar5._M_node + 2))[4] + 0x4b) == '\x01')) {
        psVar3 = *(string **)(message + 8);
        std::operator+(&local_80,"Expanded map entry type ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       **(undefined8 **)(iVar5._M_node + 2));
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
        psVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_c0.first.field_2._M_allocated_capacity = *psVar7;
          local_c0.first.field_2._8_8_ = puVar6[3];
          local_c0.first._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          local_c0.first.field_2._M_allocated_capacity = *psVar7;
          local_c0.first._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_c0.first._M_string_length = puVar6[1];
        *puVar6 = psVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        AddError(local_98,psVar3,&local_90->super_Message,NAME,&local_c0.first);
        message = local_88;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.first._M_dataplus._M_p != paVar9) {
          operator_delete(local_c0.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0x50;
    } while (lVar10 < *(int *)(message + 0x74));
  }
  if (0 < *(int *)(message + 0x6c)) {
    lVar8 = 0;
    lVar10 = 0;
    do {
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
              ::find(&local_60,*(key_type **)(*(long *)(message + 0x30) + lVar8));
      if (((_Rb_tree_header *)iVar5._M_node != &local_60._M_impl.super__Rb_tree_header) &&
         (*(char *)((*(undefined8 **)(iVar5._M_node + 2))[4] + 0x4b) == '\x01')) {
        psVar3 = *(string **)(message + 8);
        std::operator+(&local_80,"Expanded map entry type ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       **(undefined8 **)(iVar5._M_node + 2));
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
        psVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_c0.first.field_2._M_allocated_capacity = *psVar7;
          local_c0.first.field_2._8_8_ = puVar6[3];
          local_c0.first._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          local_c0.first.field_2._M_allocated_capacity = *psVar7;
          local_c0.first._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_c0.first._M_string_length = puVar6[1];
        *puVar6 = psVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        AddError(local_98,psVar3,&local_90->super_Message,NAME,&local_c0.first);
        message = local_88;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.first._M_dataplus._M_p != paVar9) {
          operator_delete(local_c0.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0x30;
    } while (lVar10 < *(int *)(message + 0x6c));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void DescriptorBuilder::DetectMapConflicts(const Descriptor* message,
                                           const DescriptorProto& proto) {
  std::map<std::string, const Descriptor*> seen_types;
  for (int i = 0; i < message->nested_type_count(); ++i) {
    const Descriptor* nested = message->nested_type(i);
    std::pair<std::map<std::string, const Descriptor*>::iterator, bool> result =
        seen_types.insert(std::make_pair(nested->name(), nested));
    if (!result.second) {
      if (result.first->second->options().map_entry() ||
          nested->options().map_entry()) {
        AddError(message->full_name(), proto,
                 DescriptorPool::ErrorCollector::NAME,
                 "Expanded map entry type " + nested->name() +
                     " conflicts with an existing nested message type.");
      }
    }
    // Recursively test on the nested types.
    DetectMapConflicts(message->nested_type(i), proto.nested_type(i));
  }
  // Check for conflicted field names.
  for (int i = 0; i < message->field_count(); ++i) {
    const FieldDescriptor* field = message->field(i);
    std::map<std::string, const Descriptor*>::iterator iter =
        seen_types.find(field->name());
    if (iter != seen_types.end() && iter->second->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Expanded map entry type " + iter->second->name() +
                   " conflicts with an existing field.");
    }
  }
  // Check for conflicted enum names.
  for (int i = 0; i < message->enum_type_count(); ++i) {
    const EnumDescriptor* enum_desc = message->enum_type(i);
    std::map<std::string, const Descriptor*>::iterator iter =
        seen_types.find(enum_desc->name());
    if (iter != seen_types.end() && iter->second->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Expanded map entry type " + iter->second->name() +
                   " conflicts with an existing enum type.");
    }
  }
  // Check for conflicted oneof names.
  for (int i = 0; i < message->oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof_desc = message->oneof_decl(i);
    std::map<std::string, const Descriptor*>::iterator iter =
        seen_types.find(oneof_desc->name());
    if (iter != seen_types.end() && iter->second->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Expanded map entry type " + iter->second->name() +
                   " conflicts with an existing oneof type.");
    }
  }
}